

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureStore
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd,Uint32 ArrayDim)

{
  const_iterator cVar1;
  const_iterator cVar2;
  iterator *piVar3;
  const_iterator cVar4;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var5;
  _List_node_base *p_Var6;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos;
  uint uVar7;
  ulong uVar8;
  const_iterator __position;
  string err;
  undefined1 local_2c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  size_t local_280;
  ConversionStream *local_278;
  iterator *local_270;
  const_iterator local_268;
  uint local_25c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  ulong local_58;
  String local_50;
  
  Pos._M_node = Token->_M_node;
  local_278 = this;
  if (ArrayDim == 0xffffffff) {
    _Var5._M_node = ScopeEnd->_M_node;
    p_Var6 = _Var5._M_node;
  }
  else {
    uVar8 = (ulong)ArrayDim;
    local_25c = ArrayDim + 1;
    uVar7 = 0;
    local_270 = Token;
    local_268._M_node = (_List_node_base *)ScopeEnd;
    local_58 = uVar8;
    do {
      cVar1._M_node = local_268._M_node;
      Pos._M_node = (Pos._M_node)->_M_next;
      if (Pos._M_node == (local_268._M_node)->_M_next) {
        return false;
      }
      if (*(int *)&Pos._M_node[1]._M_next != 0x137) {
        return false;
      }
      local_2c8._0_8_ =
           (local_278->m_Tokens).
           super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      _Var5 = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                        ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)local_2c8,
                         local_268._M_node,Pos);
      p_Var6 = local_270->_M_node;
      if (p_Var6 == (cVar1._M_node)->_M_next) {
        FormatString<char[48]>
                  ((string *)local_2c8,
                   (char (*) [48])"Unable to find matching closing square bracket.");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_50,local_278,local_270,4);
        p_Var6 = (_List_node_base *)0x7bc;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessRWTextureStore",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x7bc,(string *)local_2c8,(char (*) [2])0x82ea05,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        uVar8 = local_58;
        if ((_List_node_base *)local_2c8._0_8_ != (_List_node_base *)(local_2c8 + 0x10)) {
          operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
          uVar8 = local_58;
        }
      }
      if (*(int *)&_Var5._M_node[1]._M_next != 0x138) {
        FormatString<char[26],char[60]>
                  ((string *)local_2c8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ClosingStapleToken->Type == TokenType::ClosingSquareBracket",
                   (char (*) [60])p_Var6);
        DebugAssertionFailed
                  ((Char *)local_2c8._0_8_,"ProcessRWTextureStore",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x7c1);
        if ((_List_node_base *)local_2c8._0_8_ != (_List_node_base *)(local_2c8 + 0x10)) {
          operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
        }
      }
      if (uVar7 < (uint)uVar8) {
        Pos = _Var5;
      }
      uVar7 = uVar7 + 1;
    } while (local_25c != uVar7);
    p_Var6 = (local_268._M_node)->_M_next;
    Token = local_270;
  }
  cVar1._M_node = (_Var5._M_node)->_M_next;
  if ((cVar1._M_node != p_Var6) &&
     (__position._M_node = cVar1._M_node, *(int *)&cVar1._M_node[1]._M_next == 0x144)) {
    do {
      if (*(int *)&__position._M_node[1]._M_next == 0x13e) break;
      __position._M_node = (__position._M_node)->_M_next;
    } while (__position._M_node != p_Var6);
    if (__position._M_node != p_Var6) {
      cVar2._M_node = Token->_M_node;
      local_258 = &local_248;
      local_268._M_node = _Var5._M_node;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"imageStore","");
      std::__cxx11::string::string
                ((string *)&local_78,(char *)Token->_M_node[3]._M_prev,(allocator *)&local_50);
      local_2c8._8_8_ = &local_2b0;
      local_2c8._0_4_ = 0x13b;
      if (local_258 == &local_248) {
        local_2b0._8_8_ = local_248._8_8_;
      }
      else {
        local_2c8._8_8_ = local_258;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_248._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_248._M_local_buf[0];
      local_278 = (ConversionStream *)&local_278->m_Tokens;
      local_2a0._M_p = (pointer)&local_290;
      local_2c8._16_8_ = local_250;
      local_250 = 0;
      local_248._M_local_buf[0] = '\0';
      if (local_78 == &local_68) {
        local_290._8_8_ = local_68._8_8_;
      }
      else {
        local_2a0._M_p = (pointer)local_78;
      }
      local_290._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_68._M_local_buf[0];
      local_298 = local_70;
      local_70 = 0;
      local_68._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_258 = &local_248;
      local_78 = &local_68;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,cVar2,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(local_68._M_allocated_capacity._1_7_,
                                          local_68._M_local_buf[0]) + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,
                        CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0]) +
                        1);
      }
      cVar2._M_node = Token->_M_node;
      local_270 = Token;
      local_98 = &local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"(","");
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      local_2c8._0_4_ = 0x135;
      local_2c8._8_8_ = &local_2b0;
      if (local_98 == &local_88) {
        local_2b0._8_8_ = local_88._8_8_;
      }
      else {
        local_2c8._8_8_ = local_98;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_88._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_88._M_local_buf[0];
      local_2c8._16_8_ = local_90;
      local_90 = 0;
      local_88._M_local_buf[0] = '\0';
      local_2a0._M_p = (pointer)&local_290;
      if (local_b8 == &local_a8) {
        local_290._8_8_ = local_a8._8_8_;
      }
      else {
        local_2a0._M_p = (pointer)local_b8;
      }
      local_290._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_a8._M_local_buf[0];
      local_298 = local_b0;
      local_b0 = 0;
      local_a8._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_b8 = &local_a8;
      local_98 = &local_88;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,cVar2,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,
                                          local_a8._M_local_buf[0]) + 1);
      }
      piVar3 = local_270;
      if (local_98 != &local_88) {
        operator_delete(local_98,CONCAT71(local_88._M_allocated_capacity._1_7_,
                                          local_88._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&piVar3->_M_node[3]._M_prev,0,(char *)piVar3->_M_node[4]._M_next,0x8fd755);
      std::__cxx11::string::_M_replace
                ((ulong)&Pos._M_node[3]._M_prev,0,(char *)Pos._M_node[4]._M_next,0x82b9e8);
      *(undefined4 *)&Pos._M_node[1]._M_next = 0x13f;
      std::__cxx11::string::_M_replace
                ((ulong)&Pos._M_node[1]._M_prev,0,(char *)Pos._M_node[2]._M_next,0x853c4b);
      cVar2._M_node = (Pos._M_node)->_M_next;
      local_d8 = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"_ToIvec","");
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8," ","");
      local_2c8._0_4_ = 0x13b;
      if (local_d8 == &local_c8) {
        local_2b0._8_8_ = local_c8._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_d8;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_c8._M_local_buf[0];
      local_2c8._16_8_ = local_d0;
      local_d0 = 0;
      local_c8._M_local_buf[0] = '\0';
      local_2a0._M_p = (pointer)&local_290;
      if (local_f8 == &local_e8) {
        local_290._8_8_ = local_e8._8_8_;
      }
      else {
        local_2a0._M_p = (pointer)local_f8;
      }
      local_290._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_e8._M_local_buf[0];
      local_298 = local_f0;
      local_f0 = 0;
      local_e8._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_f8 = &local_e8;
      local_d8 = &local_c8;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,cVar2,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,
                                          local_e8._M_local_buf[0]) + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,CONCAT71(local_c8._M_allocated_capacity._1_7_,
                                          local_c8._M_local_buf[0]) + 1);
      }
      local_118 = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"(","");
      local_138 = &local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
      local_2c8._0_4_ = 0x135;
      if (local_118 == &local_108) {
        local_2b0._8_8_ = local_108._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_118;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_108._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_108._M_local_buf[0];
      local_2c8._16_8_ = local_110;
      local_110 = 0;
      local_108._M_local_buf[0] = '\0';
      local_2a0._M_p = (pointer)&local_290;
      if (local_138 == &local_128) {
        local_290._8_8_ = local_128._8_8_;
      }
      else {
        local_2a0._M_p = (pointer)local_138;
      }
      local_290._M_allocated_capacity._1_7_ = local_128._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_128._M_local_buf[0];
      local_298 = local_130;
      local_130 = 0;
      local_128._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_138 = &local_128;
      local_118 = &local_108;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,cVar2,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,
                        CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]) +
                        1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,
                        CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) +
                        1);
      }
      local_158 = &local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,")","");
      local_178 = &local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
      local_2c8._0_4_ = 0x136;
      if (local_158 == &local_148) {
        local_2b0._8_8_ = local_148._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_158;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_148._M_local_buf[0];
      local_2c8._16_8_ = local_150;
      local_150 = 0;
      local_148._M_local_buf[0] = '\0';
      local_2a0._M_p = (pointer)&local_290;
      if (local_178 == &local_168) {
        local_290._8_8_ = local_168._8_8_;
      }
      else {
        local_2a0._M_p = (pointer)local_178;
      }
      local_290._M_allocated_capacity._1_7_ = local_168._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_168._M_local_buf[0];
      local_298 = local_170;
      local_170 = 0;
      local_168._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_178 = &local_168;
      local_158 = &local_148;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,local_268,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,
                        CONCAT71(local_168._M_allocated_capacity._1_7_,local_168._M_local_buf[0]) +
                        1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,
                        CONCAT71(local_148._M_allocated_capacity._1_7_,local_148._M_local_buf[0]) +
                        1);
      }
      cVar4._M_node = local_268._M_node;
      std::__cxx11::string::_M_replace
                ((ulong)&local_268._M_node[3]._M_prev,0,(char *)local_268._M_node[4]._M_next,
                 0x82b9e8);
      *(undefined4 *)&cVar4._M_node[1]._M_next = 0x13f;
      std::__cxx11::string::_M_replace
                ((ulong)&cVar4._M_node[1]._M_prev,0,(char *)cVar4._M_node[2]._M_next,0x853c4b);
      std::__cxx11::string::_M_replace
                ((ulong)&cVar1._M_node[3]._M_prev,0,(char *)cVar1._M_node[4]._M_next,0x82b9e8);
      *(undefined4 *)&cVar1._M_node[1]._M_next = 0x135;
      std::__cxx11::string::_M_replace
                ((ulong)&cVar1._M_node[1]._M_prev,0,(char *)cVar1._M_node[2]._M_next,0x81d137);
      local_198 = &local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"_ExpandVector","");
      local_1b8 = &local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8," ","");
      local_2c8._0_4_ = 0x13b;
      if (local_198 == &local_188) {
        local_2b0._8_8_ = local_188._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_198;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_188._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_188._M_local_buf[0];
      local_2c8._16_8_ = local_190;
      local_190 = 0;
      local_188._M_local_buf[0] = '\0';
      local_2a0._M_p = (pointer)&local_290;
      if (local_1b8 == &local_1a8) {
        local_290._8_8_ = local_1a8._8_8_;
      }
      else {
        local_2a0._M_p = (pointer)local_1b8;
      }
      local_290._M_allocated_capacity._1_7_ = local_1a8._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_1a8._M_local_buf[0];
      local_298 = local_1b0;
      local_1b0 = 0;
      local_1a8._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_1b8 = &local_1a8;
      local_198 = &local_188;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,cVar1,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8,
                        CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) +
                        1);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198,
                        CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) +
                        1);
      }
      local_1d8 = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,")","");
      local_1f8 = &local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
      local_2c8._0_4_ = 0x136;
      if (local_1d8 == &local_1c8) {
        local_2b0._8_8_ = local_1c8._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_1d8;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_1c8._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_1c8._M_local_buf[0];
      local_2c8._16_8_ = local_1d0;
      local_1d0 = 0;
      local_1c8._M_local_buf[0] = '\0';
      if (local_1f8 == &local_1e8) {
        local_290._8_8_ = local_1e8._8_8_;
        local_2a0._M_p = (pointer)&local_290;
      }
      else {
        local_2a0._M_p = (pointer)local_1f8;
      }
      local_290._M_allocated_capacity._1_7_ = local_1e8._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_1e8._M_local_buf[0];
      local_298 = local_1f0;
      local_1f0 = 0;
      local_1e8._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_1f8 = &local_1e8;
      local_1d8 = &local_1c8;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,__position,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,
                        CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) +
                        1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,
                        CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) +
                        1);
      }
      local_218 = &local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,")","");
      local_238 = &local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
      local_2c8._0_4_ = 0x136;
      if (local_218 == &local_208) {
        local_2b0._8_8_ = local_208._8_8_;
        local_2c8._8_8_ = &local_2b0;
      }
      else {
        local_2c8._8_8_ = local_218;
      }
      local_2b0._M_allocated_capacity._1_7_ = local_208._M_allocated_capacity._1_7_;
      local_2b0._M_local_buf[0] = local_208._M_local_buf[0];
      local_2c8._16_8_ = local_210;
      local_210 = 0;
      local_208._M_local_buf[0] = '\0';
      if (local_238 == &local_228) {
        local_290._8_8_ = local_228._8_8_;
        local_2a0._M_p = (pointer)&local_290;
      }
      else {
        local_2a0._M_p = (pointer)local_238;
      }
      local_290._M_allocated_capacity._1_7_ = local_228._M_allocated_capacity._1_7_;
      local_290._M_local_buf[0] = local_228._M_local_buf[0];
      local_298 = local_230;
      local_230 = 0;
      local_228._M_local_buf[0] = '\0';
      local_280 = 0xffffffffffffffff;
      local_238 = &local_228;
      local_218 = &local_208;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      emplace<Diligent::Parsing::HLSLTokenInfo>
                ((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  *)local_278,__position,(HLSLTokenInfo *)local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_p != &local_290) {
        operator_delete(local_2a0._M_p,local_290._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._8_8_ != &local_2b0) {
        operator_delete((void *)local_2c8._8_8_,local_2b0._M_allocated_capacity + 1);
      }
      if (local_238 != &local_228) {
        operator_delete(local_238,
                        CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]) +
                        1);
      }
      piVar3 = local_270;
      if (local_218 != &local_208) {
        operator_delete(local_218,
                        CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]) +
                        1);
      }
      piVar3->_M_node = cVar2._M_node;
      return true;
    }
  }
  return false;
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureStore(TokenListType::iterator&       Token,
                                                                     const TokenListType::iterator& ScopeEnd,
                                                                     Uint32                         ArrayDim)
{
    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    // ^

    // Find the last pair of square brackets, skipping texture array indexing
    auto OpenStapleToken    = Token;
    auto ClosingStapleToken = ScopeEnd;
    for (Uint32 ArrayIdx = 0; ArrayIdx < ArrayDim + 1; ++ArrayIdx)
    {
        ++OpenStapleToken;
        if (OpenStapleToken == ScopeEnd || OpenStapleToken->Type != TokenType::OpenSquareBracket)
            return false;

        ClosingStapleToken = Parsing::FindMatchingBracket(m_Tokens.begin(), ScopeEnd, OpenStapleToken);
        VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching closing square bracket.");

        // RWTex[Location[idx].xy]
        //                       ^
        //              ClosingStapleToken
        VERIFY_EXPR(ClosingStapleToken->Type == TokenType::ClosingSquareBracket);

        if (ArrayIdx < ArrayDim)
        {
            OpenStapleToken = ClosingStapleToken;
            // RWTexArray[idx[0]][Location.xy]
            //                  ^
            //            OpenStapleToken
        }
    }
    //      RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //           ^           ^
    //  OpenStaplePos     ClosingStaplePos

    auto AssignmentToken = ClosingStapleToken;
    ++AssignmentToken;

    if (AssignmentToken == ScopeEnd || AssignmentToken->Type != TokenType::Assignment)
    {
        // The function is called for ALL RW texture objects found, so this may not be
        // the store operation, but something else (for instance:
        // InterlockedExchange(Tex2D_I1[GTid.xy], 1, iOldVal) )
        return false;
    }

    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                    ^
    //              AssignmentToken

    auto SemicolonToken = AssignmentToken;
    while (SemicolonToken != ScopeEnd && SemicolonToken->Type != TokenType::Semicolon)
        ++SemicolonToken;
    if (SemicolonToken == ScopeEnd)
        return false;
    // RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    // ^                                              ^
    // Token                                    SemicolonToken

    m_Tokens.insert(Token, TokenInfo(TokenType::Identifier, "imageStore", Token->Delimiter.c_str()));
    m_Tokens.insert(Token, TokenInfo(TokenType::OpenParen, "(", ""));
    Token->Delimiter = " ";
    // imageStore( RWTex[Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //             ^    ^
    //          Token  OpenStapleToken

    OpenStapleToken->Delimiter = "";
    OpenStapleToken->Type      = TokenType::Comma;
    OpenStapleToken->Literal   = ",";
    // imageStore( RWTex,Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                  ^           ^
    //      OpenStapleToken     ClosingStapleToken

    auto LocationToken = OpenStapleToken;
    ++LocationToken;
    m_Tokens.insert(LocationToken, TokenInfo(TokenType::Identifier, "_ToIvec", " "));
    m_Tokens.insert(LocationToken, TokenInfo(TokenType::OpenParen, "(", ""));
    // imageStore( RWTex, _ToIvec(Location.xy] = float4(0.0, 0.0, 0.0, 1.0);
    //                            ^          ^
    //                  LocationToken     ClosingStapleToken

    m_Tokens.insert(ClosingStapleToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex, _ToIvec(Location.xy)] = float4(0.0, 0.0, 0.0, 1.0);
    //                                        ^
    //                                ClosingStapleToken

    ClosingStapleToken->Delimiter = "";
    ClosingStapleToken->Type      = TokenType::Comma;
    ClosingStapleToken->Literal   = ",";
    // imageStore( RWTex, _ToIvec(Location.xy), = float4(0.0, 0.0, 0.0, 1.0);
    //                                          ^
    //                                   AssignmentToken

    AssignmentToken->Delimiter = "";
    AssignmentToken->Type      = TokenType::OpenParen;
    AssignmentToken->Literal   = "(";
    // imageStore( RWTex, _ToIvec(Location.xy),( float4(0.0, 0.0, 0.0, 1.0);
    //                                         ^
    //                                   AssignmentToken

    m_Tokens.insert(AssignmentToken, TokenInfo(TokenType::Identifier, "_ExpandVector", " "));
    // imageStore( RWTex, _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0);
    //                                                       ^                           ^
    //                                                AssignmentToken               SemicolonToken

    // Insert closing bracket for _ExpandVector
    m_Tokens.insert(SemicolonToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0));
    //                                                                                     ^
    //                                                                              SemicolonToken

    // Insert closing bracket for imageStore
    m_Tokens.insert(SemicolonToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0)));
    //                                                                                      ^
    //                                                                               SemicolonToken

    Token = LocationToken;
    // imageStore( RWTex,  _ToIvec(Location.xy), _ExpandVector( float4(0.0, 0.0, 0.0, 1.0)));
    //                             ^

    // Note that 'Location' may require further processing as it itself may be e.g. image load operation

    return true;
}